

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O0

void timer_tick(int cpu_cyc)

{
  uint n_00;
  short in_DI;
  uint32_t remain;
  uint32_t clocks;
  int n;
  int i;
  int local_8;
  
  for (local_8 = 0; local_8 < (int)(uint)bus->num_active_timers; local_8 = local_8 + 1) {
    n_00 = (uint)bus->TMACTIVE[local_8];
    if (((bus->TMSTART[(int)n_00] & 1U) != 0) && ((bus->TMCNT_H[(int)n_00].raw >> 2 & 1) == 0)) {
      bus->TMINT[(int)n_00].ticks = bus->TMINT[(int)n_00].ticks + in_DI;
      timer_inc(n_00,(int)(uint)bus->TMINT[(int)n_00].ticks >>
                     ((byte)timer_shift[bus->TMCNT_H[(int)n_00].raw & 3] & 0x1f),
                (uint)bus->TMINT[(int)n_00].ticks & timer_mask[bus->TMCNT_H[(int)n_00].raw & 3]);
    }
  }
  return;
}

Assistant:

void timer_tick(int cpu_cyc) {
    for (int i = 0; i < bus->num_active_timers; i++) {
        int n = bus->TMACTIVE[i];
        if (bus->TMSTART[n] && !bus->TMCNT_H[n].cascade) {
            bus->TMINT[n].ticks += cpu_cyc;
            word clocks = bus->TMINT[n].ticks >> timer_shift[bus->TMCNT_H[n].frequency];
            word remain = bus->TMINT[n].ticks & timer_mask[bus->TMCNT_H[n].frequency];
            timer_inc(n, clocks, remain);
        }
    }
}